

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

string * leveldb::InfoLogFileName(string *dbname)

{
  long lVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_00000008;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+(dbname,in_stack_00000008);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string InfoLogFileName(const std::string& dbname) {
  return dbname + "/LOG";
}